

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O1

void __thiscall Js::DebugDocument::CloseDocument(DebugDocument *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->m_breakpointList != (BreakpointProbeList *)0x0) {
    (this->m_breakpointList->
    super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
    this->m_breakpointList = (BreakpointProbeList *)0x0;
  }
  if (this->utf8SourceInfo == (Utf8SourceInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                ,0x22,"(this->utf8SourceInfo != nullptr)",
                                "this->utf8SourceInfo != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((this->functionBody).ptr != (FunctionBody *)0x0) {
    Memory::RecyclerRootPtr<Js::FunctionBody>::Unroot
              (&this->functionBody,((this->utf8SourceInfo->m_scriptContext).ptr)->recycler);
  }
  this->utf8SourceInfo = (Utf8SourceInfo *)0x0;
  return;
}

Assistant:

void DebugDocument::CloseDocument()
    {
        if (this->m_breakpointList != nullptr)
        {
            this->ClearAllBreakPoints();
        }

        Assert(this->utf8SourceInfo != nullptr);

        if (functionBody)
        {
            functionBody.Unroot(this->utf8SourceInfo->GetScriptContext()->GetRecycler());
        }

        this->utf8SourceInfo = nullptr;
    }